

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitops.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  int iVar7;
  ulong x;
  bool bVar8;
  
  iVar7 = 100000000;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    uVar1 = rand();
    iVar2 = rand();
    x = (long)iVar2 | (ulong)uVar1 << 0x20;
    uVar1 = trailing_zeros(x);
    uVar3 = reference_trailing_zeros(x);
    uVar4 = leading_zeros_64(x);
    uVar5 = reference_leading_zeros(x);
    if (uVar1 != uVar3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error! trailing zeros: ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," != ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    if (uVar4 != uVar5) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error! leading zeros: ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," != ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  return 0;
}

Assistant:

int main()
{
    // run a large set of random tests
    unsigned int sum = 0;
    int num_tests = 100000000;
    for (int i = 0; i < num_tests; ++i)
    {
        uint64_t x = 0;
        x |= static_cast<uint64_t>(rand()) << 32;
        x |= static_cast<uint64_t>(rand());

        unsigned int t1 = trailing_zeros(x);
        unsigned int t2 = reference_trailing_zeros(x);
        //unsigned int t2 = t1;
        //sum += t2;

        unsigned int l1 = leading_zeros(x);
        unsigned int l2 = reference_leading_zeros(x);
        //unsigned int l2 = l1;
        //sum += l2;

        if (t1 != t2) {
            std::cerr << "Error! trailing zeros: " << t1 << " != " << t2 << std::endl;
        }
        if (l1 != l2) {
            std::cerr << "Error! leading zeros: " << l1 << " != " << l2 << std::endl;
        }
    }
    return sum;
}